

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QTableWidgetItem * __thiscall QTableWidget::verticalHeaderItem(QTableWidget *this,int row)

{
  QTableModel *pQVar1;
  QTableWidgetItem *pQVar2;
  
  pQVar1 = QTableWidgetPrivate::tableModel
                     (*(QTableWidgetPrivate **)
                       &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                        super_QFrame.super_QWidget.field_0x8);
  if ((ulong)(long)row < (ulong)(pQVar1->verticalHeaderItems).d.size) {
    pQVar2 = (pQVar1->verticalHeaderItems).d.ptr[row];
  }
  else {
    pQVar2 = (QTableWidgetItem *)0x0;
  }
  return pQVar2;
}

Assistant:

QTableWidgetItem *QTableWidget::verticalHeaderItem(int row) const
{
    Q_D(const QTableWidget);
    return d->tableModel()->verticalHeaderItem(row);
}